

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

double __thiscall spdlog::logger::log(logger *this,double __x)

{
  source_loc loc;
  string_view_t msg;
  size_t in_RCX;
  char *in_RDX;
  level_enum in_ESI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  char *in_stack_00000018;
  string_view_t local_b0;
  undefined8 local_a0;
  undefined8 local_98;
  char *local_90;
  undefined1 local_88 [8];
  log_msg log_msg;
  bool traceback_enabled;
  bool log_enabled;
  level_enum lvl_local;
  logger *this_local;
  string_view_t msg_local;
  
  log_msg.payload.size_._4_4_ = in_ESI;
  log_msg.payload.size_._3_1_ = should_log(this,in_ESI);
  log_msg.payload.size_._2_1_ = details::backtracer::enabled(&this->tracer_);
  if (((log_msg.payload.size_._3_1_ & 1) != 0) ||
     (dVar1 = extraout_XMM0_Qa, (bool)log_msg.payload.size_._2_1_)) {
    local_a0 = in_stack_00000008;
    local_98 = in_stack_00000010;
    local_90 = in_stack_00000018;
    fmt::v7::basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
              (&local_b0,&this->name_);
    msg.size_ = in_RCX;
    msg.data_ = in_RDX;
    loc._8_8_ = local_98;
    loc.filename = (char *)local_a0;
    loc.funcname = local_90;
    details::log_msg::log_msg((log_msg *)local_88,loc,local_b0,log_msg.payload.size_._4_4_,msg);
    log_it_(this,(log_msg *)local_88,(bool)(log_msg.payload.size_._3_1_ & 1),
            (bool)(log_msg.payload.size_._2_1_ & 1));
    dVar1 = extraout_XMM0_Qa_00;
  }
  return dVar1;
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t msg)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }

        details::log_msg log_msg(loc, name_, lvl, msg);
        log_it_(log_msg, log_enabled, traceback_enabled);
    }